

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineSamplerTests.cpp
# Opt level: O1

VkSamplerCreateInfo * __thiscall
vkt::pipeline::anon_unknown_0::SamplerLodTest::getSamplerCreateInfo
          (VkSamplerCreateInfo *__return_storage_ptr__,SamplerLodTest *this)

{
  SamplerTest::getSamplerCreateInfo(__return_storage_ptr__,&this->super_SamplerTest);
  __return_storage_ptr__->mipmapMode =
       *(VkSamplerMipmapMode *)&(this->super_SamplerTest).field_0x124;
  __return_storage_ptr__->minLod = this->m_minLod;
  __return_storage_ptr__->maxLod = this->m_maxLod;
  __return_storage_ptr__->mipLodBias = this->m_mipLodBias;
  return __return_storage_ptr__;
}

Assistant:

VkSamplerCreateInfo SamplerLodTest::getSamplerCreateInfo (void) const
{
	VkSamplerCreateInfo samplerParams = SamplerTest::getSamplerCreateInfo();

	samplerParams.mipmapMode	= m_mipmapMode;
	samplerParams.minLod		= m_minLod;
	samplerParams.maxLod		= m_maxLod;
	samplerParams.mipLodBias	= m_mipLodBias;

	return samplerParams;
}